

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PendingListAppend
              (PendingList **pp,sqlite3_int64 iDocid,sqlite3_int64 iCol,sqlite3_int64 iPos,int *pRc)

{
  PendingList *pPVar1;
  int iVar2;
  sqlite3_int64 i;
  PendingList *p;
  PendingList *local_38;
  
  local_38 = *pp;
  i = iDocid;
  if (local_38 == (PendingList *)0x0) {
LAB_001d5862:
    iVar2 = fts3PendingListAppendVarint(&local_38,i);
    if (iVar2 != 0) goto LAB_001d58d1;
    local_38->iLastCol = -1;
    local_38->iLastPos = 0;
    local_38->iLastDocid = iDocid;
  }
  else {
    i = iDocid - local_38->iLastDocid;
    if (i != 0) {
      local_38->nData = local_38->nData + 1;
      goto LAB_001d5862;
    }
  }
  if (iCol < 1) {
    if (-1 < iCol) goto LAB_001d58ad;
  }
  else {
    if (local_38->iLastCol != iCol) {
      iVar2 = fts3PendingListAppendVarint(&local_38,1);
      if ((iVar2 != 0) || (iVar2 = fts3PendingListAppendVarint(&local_38,iCol), iVar2 != 0))
      goto LAB_001d58d1;
      local_38->iLastCol = iCol;
      local_38->iLastPos = 0;
    }
LAB_001d58ad:
    iVar2 = fts3PendingListAppendVarint(&local_38,(iPos - local_38->iLastPos) + 2);
    if (iVar2 != 0) goto LAB_001d58d1;
    local_38->iLastPos = iPos;
  }
  iVar2 = 0;
LAB_001d58d1:
  *pRc = iVar2;
  pPVar1 = *pp;
  if (local_38 != pPVar1) {
    *pp = local_38;
  }
  return (uint)(local_38 != pPVar1);
}

Assistant:

static int fts3PendingListAppend(
  PendingList **pp,               /* IN/OUT: PendingList structure */
  sqlite3_int64 iDocid,           /* Docid for entry to add */
  sqlite3_int64 iCol,             /* Column for entry to add */
  sqlite3_int64 iPos,             /* Position of term for entry to add */
  int *pRc                        /* OUT: Return code */
){
  PendingList *p = *pp;
  int rc = SQLITE_OK;

  assert( !p || p->iLastDocid<=iDocid );

  if( !p || p->iLastDocid!=iDocid ){
    sqlite3_int64 iDelta = iDocid - (p ? p->iLastDocid : 0);
    if( p ){
      assert( p->nData<p->nSpace );
      assert( p->aData[p->nData]==0 );
      p->nData++;
    }
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iDelta)) ){
      goto pendinglistappend_out;
    }
    p->iLastCol = -1;
    p->iLastPos = 0;
    p->iLastDocid = iDocid;
  }
  if( iCol>0 && p->iLastCol!=iCol ){
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, 1))
     || SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iCol))
    ){
      goto pendinglistappend_out;
    }
    p->iLastCol = iCol;
    p->iLastPos = 0;
  }
  if( iCol>=0 ){
    assert( iPos>p->iLastPos || (iPos==0 && p->iLastPos==0) );
    rc = fts3PendingListAppendVarint(&p, 2+iPos-p->iLastPos);
    if( rc==SQLITE_OK ){
      p->iLastPos = iPos;
    }
  }

 pendinglistappend_out:
  *pRc = rc;
  if( p!=*pp ){
    *pp = p;
    return 1;
  }
  return 0;
}